

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O3

void __thiscall
MIDIStreamer::CreateSMF(MIDIStreamer *this,TArray<unsigned_char,_unsigned_char> *file,int looplimit)

{
  uint uVar1;
  BYTE *pBVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  long lVar5;
  DWORD (*paDVar6) [384];
  DWORD DVar7;
  DWORD DVar8;
  DWORD *__src;
  uchar *__dest;
  uint value;
  DWORD DVar9;
  byte bVar10;
  
  (*(this->super_MusInfo)._vptr_MusInfo[0x16])(this,1);
  iVar3 = 0x1e;
  if (0 < looplimit) {
    iVar3 = looplimit;
  }
  this->LoopLimit = iVar3;
  (*(this->super_MusInfo)._vptr_MusInfo[0x18])(this);
  this->Tempo = this->InitialTempo;
  TArray<unsigned_char,_unsigned_char>::Grow(file,0x1d);
  file->Count = file->Count + 0x1d;
  pBVar2 = file->Array;
  pBVar2[0xd] = '\0';
  pBVar2[0xe] = 'M';
  pBVar2[0xf] = 'T';
  pBVar2[0x10] = 'r';
  pBVar2[0x11] = 'k';
  pBVar2[0x12] = '\0';
  pBVar2[0x13] = '\0';
  pBVar2[0x14] = '\0';
  pBVar2[0x15] = '\0';
  pBVar2[0x16] = '\0';
  pBVar2[0x17] = 0xff;
  pBVar2[0x18] = 'Q';
  pBVar2[0x19] = '\x03';
  pBVar2[0x1a] = '\0';
  pBVar2[0x1b] = '\0';
  pBVar2[0x1c] = '\0';
  builtin_memcpy(pBVar2,"MThd",5);
  pBVar2[5] = '\0';
  pBVar2[6] = '\0';
  pBVar2[7] = '\x06';
  pBVar2[8] = '\0';
  pBVar2[9] = '\0';
  pBVar2[10] = '\0';
  pBVar2[0xb] = '\x01';
  pBVar2[0xc] = '\0';
  pBVar2[0xd] = '\0';
  pBVar2[0xe] = 'M';
  pBVar2[0xf] = 'T';
  file->Array[0xc] = *(uchar *)((long)&this->Division + 1);
  file->Array[0xd] = (uchar)this->Division;
  file->Array[0x1a] = *(uchar *)((long)&this->InitialTempo + 2);
  file->Array[0x1b] = *(uchar *)((long)&this->InitialTempo + 1);
  file->Array[0x1c] = (uchar)this->InitialTempo;
  iVar3 = (*(this->super_MusInfo)._vptr_MusInfo[0x19])(this);
  DVar7 = 0;
  if ((char)iVar3 == '\0') {
    DVar9 = 0xff;
    DVar7 = 0;
    do {
      iVar3 = (*(this->super_MusInfo)._vptr_MusInfo[0x1c])
                        (this,this->Events,this->Events + 1,600000000);
      for (paDVar6 = this->Events; paDVar6 < (undefined1 *)CONCAT44(extraout_var,iVar3);
          paDVar6 = (DWORD (*) [384])((long)*paDVar6 + lVar5)) {
        DVar7 = DVar7 + (*paDVar6)[0];
        uVar4 = (*paDVar6)[2] >> 0x18;
        if (uVar4 == 0x80) {
          WriteVarLen(file,DVar7);
          uVar4 = (*paDVar6)[2] & 0xffffff;
          if ((char)(*paDVar6)[3] == -0x10) {
            value = uVar4 - 1;
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = 0xf0;
            file->Count = file->Count + 1;
            WriteVarLen(file,value);
            TArray<unsigned_char,_unsigned_char>::Grow(file,value);
            uVar1 = file->Count;
            file->Count = (uVar1 + uVar4) - 1;
            __dest = file->Array + uVar1;
            __src = (DWORD *)((long)*paDVar6 + 0xd);
            uVar4 = value;
          }
          else {
            __src = *paDVar6 + 3;
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = 0xf7;
            file->Count = file->Count + 1;
            WriteVarLen(file,uVar4);
            TArray<unsigned_char,_unsigned_char>::Grow(file,uVar4);
            uVar1 = file->Count;
            file->Count = uVar1 + uVar4;
            __dest = file->Array + uVar1;
          }
          memcpy(__dest,__src,(ulong)uVar4);
LAB_0033eeff:
          DVar7 = 0;
          DVar9 = 0xff;
        }
        else {
          if (uVar4 == 1) {
            WriteVarLen(file,DVar7);
            DVar7 = (*paDVar6)[2];
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = 0xff;
            file->Count = file->Count + 1;
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = 'Q';
            file->Count = file->Count + 1;
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = '\x03';
            file->Count = file->Count + 1;
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = (uchar)(DVar7 >> 0x10);
            file->Count = file->Count + 1;
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = (uchar)(DVar7 >> 8);
            file->Count = file->Count + 1;
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = (uchar)DVar7;
            file->Count = file->Count + 1;
            goto LAB_0033eeff;
          }
          if ((*paDVar6)[2] < 0x1000000) {
            WriteVarLen(file,DVar7);
            DVar7 = (*paDVar6)[2];
            bVar10 = (byte)DVar7;
            DVar8 = DVar7;
            if ((byte)DVar9 != bVar10) {
              TArray<unsigned_char,_unsigned_char>::Grow(file,1);
              file->Array[file->Count] = bVar10;
              file->Count = file->Count + 1;
              DVar8 = (*paDVar6)[2];
              DVar9 = DVar7;
            }
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = (byte)(DVar8 >> 8) & 0x7f;
            file->Count = file->Count + 1;
            DVar7 = 0;
            if (MIDI_EventLengths[bVar10 >> 4 & 7] == '\x02') {
              bVar10 = *(byte *)((long)*paDVar6 + 10);
              TArray<unsigned_char,_unsigned_char>::Grow(file,1);
              file->Array[file->Count] = bVar10 & 0x7f;
              file->Count = file->Count + 1;
            }
          }
        }
        lVar5 = (ulong)(((*paDVar6)[2] & 0xffffff) + 3 & 0xfffffffc) + 0xc;
        if (-1 < (int)(*paDVar6)[2]) {
          lVar5 = 0xc;
        }
      }
      iVar3 = (*(this->super_MusInfo)._vptr_MusInfo[0x19])(this);
    } while ((char)iVar3 == '\0');
  }
  WriteVarLen(file,DVar7);
  TArray<unsigned_char,_unsigned_char>::Grow(file,1);
  file->Array[file->Count] = 0xff;
  file->Count = file->Count + 1;
  TArray<unsigned_char,_unsigned_char>::Grow(file,1);
  file->Array[file->Count] = '/';
  file->Count = file->Count + 1;
  TArray<unsigned_char,_unsigned_char>::Grow(file,1);
  file->Array[file->Count] = '\0';
  uVar4 = file->Count;
  file->Count = uVar4 + 1;
  iVar3 = uVar4 - 0x15;
  file->Array[0x12] = (uchar)((uint)iVar3 >> 0x18);
  file->Array[0x13] = (uchar)((uint)iVar3 >> 0x10);
  file->Array[0x14] = (uchar)((uint)iVar3 >> 8);
  file->Array[0x15] = (uchar)iVar3;
  this->LoopLimit = 0;
  return;
}

Assistant:

void MIDIStreamer::CreateSMF(TArray<BYTE> &file, int looplimit)
{
	DWORD delay = 0;
	BYTE running_status = 255;

	// Always create songs aimed at GM devices.
	CheckCaps(MOD_MIDIPORT);
	LoopLimit = looplimit <= 0 ? EXPORT_LOOP_LIMIT : looplimit;
	DoRestart();
	Tempo = InitialTempo;

	file.Reserve(sizeof(StaticMIDIhead));
	memcpy(&file[0], StaticMIDIhead, sizeof(StaticMIDIhead));
	file[12] = Division >> 8;
	file[13] = Division & 0xFF;
	file[26] = InitialTempo >> 16;
	file[27] = InitialTempo >> 8;
	file[28] = InitialTempo;

	while (!CheckDone())
	{
		DWORD *event_end = MakeEvents(Events[0], &Events[0][MAX_EVENTS*3], 1000000*600);
		for (DWORD *event = Events[0]; event < event_end; )
		{
			delay += event[0];
			if (MEVT_EVENTTYPE(event[2]) == MEVT_TEMPO)
			{
				WriteVarLen(file, delay);
				delay = 0;
				DWORD tempo = MEVT_EVENTPARM(event[2]);
				file.Push(MIDI_META);
				file.Push(MIDI_META_TEMPO);
				file.Push(3);
				file.Push(BYTE(tempo >> 16));
				file.Push(BYTE(tempo >> 8));
				file.Push(BYTE(tempo));
				running_status = 255;
			}
			else if (MEVT_EVENTTYPE(event[2]) == MEVT_LONGMSG)
			{
				WriteVarLen(file, delay);
				delay = 0;
				DWORD len = MEVT_EVENTPARM(event[2]);
				BYTE *bytes = (BYTE *)&event[3];
				if (bytes[0] == MIDI_SYSEX)
				{
					len--;
					file.Push(MIDI_SYSEX);
					WriteVarLen(file, len);
					memcpy(&file[file.Reserve(len)], bytes + 1, len);
				}
				else
				{
					file.Push(MIDI_SYSEXEND);
					WriteVarLen(file, len);
					memcpy(&file[file.Reserve(len)], bytes, len);
				}
				running_status = 255;
			}
			else if (MEVT_EVENTTYPE(event[2]) == 0)
			{
				WriteVarLen(file, delay);
				delay = 0;
				BYTE status = BYTE(event[2]);
				if (status != running_status)
				{
					running_status = status;
					file.Push(status);
				}
				file.Push(BYTE((event[2] >> 8) & 0x7F));
				if (MIDI_EventLengths[(status >> 4) & 7] == 2)
				{
					file.Push(BYTE((event[2] >> 16) & 0x7F));
				}
			}
			// Advance to next event
			if (event[2] < 0x80000000)
			{ // short message
				event += 3;
			}
			else
			{ // long message
				event += 3 + ((MEVT_EVENTPARM(event[2]) + 3) >> 2);
			}
		}
	}

	// End track
	WriteVarLen(file, delay);
	file.Push(MIDI_META);
	file.Push(MIDI_META_EOT);
	file.Push(0);

	// Fill in track length
	DWORD len = file.Size() - 22;
	file[18] = BYTE(len >> 24);
	file[19] = BYTE(len >> 16);
	file[20] = BYTE(len >> 8);
	file[21] = BYTE(len & 255);

	LoopLimit = 0;
}